

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O1

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::TetrahedralMesh(TPZAcademicGeoMesh *this)

{
  uint uVar1;
  TPZAcademicGeoMesh *this_00;
  long lVar2;
  TPZGeoMesh *this_01;
  long lVar3;
  int il;
  long lVar4;
  int (*paiVar5) [4];
  TPZManVector<long,_4> elnodes;
  int64_t index;
  long local_130;
  TPZVec<long> local_118;
  long local_f8 [4];
  TPZVec<long> local_d8;
  long lStack_b8;
  long local_b0;
  long lStack_a8;
  long local_a0;
  long lStack_98;
  long local_90;
  long lStack_88;
  long local_80;
  TPZAcademicGeoMesh *local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined1 local_38 [8];
  
  lVar4 = this->fNumberElements;
  uVar1 = this->fMaterialId;
  this_01 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_01);
  local_78 = this;
  GenerateNodes(this,this_01);
  this_01->fDim = 3;
  if (0 < lVar4) {
    local_70 = lVar4 + 1;
    local_58 = local_70 * local_70;
    local_130 = 0;
    local_60 = lVar4;
    do {
      local_68 = 0;
      do {
        local_48 = local_68 * local_70 + local_130;
        local_68 = local_68 + 1;
        local_50 = local_68 * local_70 + local_130;
        lVar4 = 0;
        do {
          TPZVec<long>::TPZVec(&local_d8,0);
          local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
          local_d8.fStore = &lStack_b8;
          local_d8.fNElements = 8;
          local_d8.fNAlloc = 0;
          lVar3 = local_58 * lVar4;
          lStack_b8 = local_48 + lVar3;
          local_b0 = local_48 + lVar3 + 1;
          local_a0 = local_50 + lVar3;
          lStack_a8 = lVar3 + local_50 + 1;
          local_40 = lVar4 + 1;
          lStack_88 = local_58 * local_40;
          lStack_98 = local_48 + lStack_88;
          local_90 = local_48 + lStack_88 + 1;
          local_80 = local_50 + lStack_88;
          lStack_88 = local_50 + 1 + lStack_88;
          paiVar5 = tetraedra_2;
          lVar3 = 0;
          do {
            TPZVec<long>::TPZVec(&local_118,0);
            local_118._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a0548;
            local_118.fNElements = 4;
            local_118.fNAlloc = 0;
            lVar4 = 0;
            do {
              local_f8[lVar4] = local_d8.fStore[(*paiVar5)[lVar4]];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 4);
            local_118.fStore = local_f8;
            (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (this_01,4,&local_118,(ulong)uVar1,local_38,1);
            if (local_118.fStore == local_f8) {
              local_118.fStore = (long *)0x0;
            }
            local_118.fNAlloc = 0;
            local_118._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
            if (local_118.fStore != (long *)0x0) {
              operator_delete__(local_118.fStore);
            }
            lVar4 = local_40;
            lVar2 = local_60;
            lVar3 = lVar3 + 1;
            paiVar5 = paiVar5 + 1;
          } while (lVar3 != 6);
          if (local_d8.fStore == &lStack_b8) {
            local_d8.fStore = (long *)0x0;
          }
          local_d8.fNAlloc = 0;
          local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
          if (local_d8.fStore != (long *)0x0) {
            operator_delete__(local_d8.fStore);
          }
        } while (lVar4 != lVar2);
      } while (local_68 != lVar2);
      local_130 = local_130 + 1;
    } while (local_130 != lVar2);
  }
  TPZGeoMesh::BuildConnectivity(this_01);
  this_00 = local_78;
  AddBoundaryElements(local_78,this_01);
  if (this_00->fShouldDeform != false) {
    DeformGMesh(this_00,this_01);
  }
  return this_01;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::TetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    GenerateNodes(gmesh);
    gmesh->SetDimension(3);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<6; el++)
                {
                    TPZManVector<int64_t,4> elnodes(4);
                    int64_t index;
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra_2[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
    AddBoundaryElements(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}